

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O2

void __thiscall HighsHessian::deleteCols(HighsHessian *this,HighsIndexCollection *index_collection)

{
  vector<int,_std::allocator<int>_> *__x;
  double dVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  pointer piVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  HighsInt keep_to_col;
  HighsInt from_k;
  HighsInt current_set_entry;
  HighsInt keep_from_col;
  HighsInt delete_from_col;
  HighsInt to_k;
  HighsInt delete_to_col;
  vector<int,_std::allocator<int>_> new_index;
  vector<int,_std::allocator<int>_> save_start;
  HighsInt local_8c;
  int local_88;
  HighsInt local_84;
  int local_80;
  int local_7c;
  int local_78;
  HighsInt local_74;
  HighsIndexCollection *local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if (this->dim_ != 0) {
    limits(index_collection,&local_88,&local_78);
    if (local_88 <= local_78) {
      local_8c = -1;
      local_84 = 0;
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
      local_70 = index_collection;
      std::vector<int,_std::allocator<int>_>::_M_fill_assign
                ((vector<int,_std::allocator<int>_> *)&local_68,(long)this->dim_,
                 (value_type_conflict2 *)&local_48);
      iVar9 = 0;
      iVar8 = local_88;
      do {
        if (local_78 < iVar8) break;
        updateOutInIndex(local_70,&local_7c,&local_74,&local_80,&local_8c,&local_84);
        if (iVar8 == local_88) {
          for (lVar4 = 0; lVar4 < local_7c; lVar4 = lVar4 + 1) {
            local_68._M_impl.super__Vector_impl_data._M_start[lVar4] = iVar9 + (int)lVar4;
          }
          iVar9 = iVar9 + (int)lVar4;
        }
        for (lVar4 = (long)local_80; lVar4 <= local_8c; lVar4 = lVar4 + 1) {
          local_68._M_impl.super__Vector_impl_data._M_start[lVar4] = iVar9;
          iVar9 = iVar9 + 1;
        }
        iVar8 = iVar8 + 1;
      } while (local_8c < this->dim_ + -1);
      local_8c = -1;
      local_84 = 0;
      __x = &this->start_;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_48,__x);
      lVar4 = 0;
      iVar9 = 0;
      iVar10 = 0;
      iVar8 = local_88;
      do {
        if (local_78 < iVar8) break;
        updateOutInIndex(local_70,&local_7c,&local_74,&local_80,&local_8c,&local_84);
        piVar5 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (iVar8 == local_88) {
          lVar4 = (long)(int)lVar4;
          lVar6 = 0;
          while (lVar6 < local_7c) {
            lVar7 = lVar6 * 4;
            lVar6 = lVar6 + 1;
            piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            for (lVar7 = (long)*(int *)(CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start.
                                                 _4_4_,local_48._M_impl.super__Vector_impl_data.
                                                       _M_start._0_4_) + lVar7);
                lVar7 < *(int *)(CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          local_48._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                lVar6 * 4); lVar7 = lVar7 + 1) {
              if (-1 < local_68._M_impl.super__Vector_impl_data._M_start[piVar2[lVar7]]) {
                piVar2[iVar10] = local_68._M_impl.super__Vector_impl_data._M_start[piVar2[lVar7]];
                dVar1 = pdVar3[lVar7];
                pdVar3[iVar10] = dVar1;
                iVar9 = iVar9 + (uint)(dVar1 != 0.0);
                iVar10 = iVar10 + 1;
              }
            }
            piVar5[lVar4 + 1] = iVar10;
            lVar4 = lVar4 + 1;
          }
          piVar5 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        lVar6 = (long)local_80;
        lVar4 = (long)(int)lVar4;
        while (lVar6 <= local_8c) {
          lVar7 = lVar6 * 4;
          lVar6 = lVar6 + 1;
          piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar7 = (long)*(int *)(CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start.
                                               _4_4_,local_48._M_impl.super__Vector_impl_data.
                                                     _M_start._0_4_) + lVar7);
              lVar7 < *(int *)(CONCAT44(local_48._M_impl.super__Vector_impl_data._M_start._4_4_,
                                        local_48._M_impl.super__Vector_impl_data._M_start._0_4_) +
                              lVar6 * 4); lVar7 = lVar7 + 1) {
            if (-1 < local_68._M_impl.super__Vector_impl_data._M_start[piVar2[lVar7]]) {
              piVar2[iVar10] = local_68._M_impl.super__Vector_impl_data._M_start[piVar2[lVar7]];
              dVar1 = pdVar3[lVar7];
              pdVar3[iVar10] = dVar1;
              iVar9 = iVar9 + (uint)(dVar1 != 0.0);
              iVar10 = iVar10 + 1;
            }
          }
          piVar5[lVar4 + 1] = iVar10;
          lVar4 = lVar4 + 1;
        }
        iVar8 = iVar8 + 1;
      } while (local_8c < this->dim_ + -1);
      this->dim_ = (HighsInt)lVar4;
      if (iVar9 == 0) {
        clear(this);
      }
      else {
        exactResize(this);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    }
  }
  return;
}

Assistant:

void HighsHessian::deleteCols(const HighsIndexCollection& index_collection) {
  if (this->dim_ == 0) return;
  // Can't handle non-triangular matrices yet
  assert(this->format_ == HessianFormat::kTriangular);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;
  HighsInt delete_from_col;
  HighsInt delete_to_col;
  HighsInt keep_from_col;
  HighsInt keep_to_col = -1;
  HighsInt current_set_entry = 0;

  // Initial pass creates a look-up to for the new index of columns
  // being retained, and -1 for columns being deleted
  std::vector<HighsInt> new_index;
  new_index.assign(this->dim_, -1);
  HighsInt new_dim = 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    if (k == from_k) {
      // Account for the initial columns being kept
      for (HighsInt iCol = 0; iCol < delete_from_col; iCol++)
        new_index[iCol] = new_dim++;
    }
    for (HighsInt iCol = keep_from_col; iCol <= keep_to_col; iCol++)
      new_index[iCol] = new_dim++;
    // When using a mask, to_k = this->dim_, but consecutive
    // keep/delete entries are accumulated, so may not need all passes
    if (keep_to_col >= this->dim_ - 1) break;
  }
  assert(new_dim < this->dim_);
  // Now perform the pass that deletes rows/columns
  keep_to_col = -1;
  current_set_entry = 0;
  // Have to accumulate new number of entries from the outset, as
  // entries may be lost from columns being kept before any are
  // deleted. Also keep a count of the number of nonzeros, in case the new
  HighsInt check_new_dim = new_dim;
  new_dim = 0;
  HighsInt new_num_nz = 0;
  HighsInt new_num_entries = 0;
  std::vector<HighsInt> save_start = this->start_;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, delete_from_col, delete_to_col,
                     keep_from_col, keep_to_col, current_set_entry);
    if (k == from_k) {
      // Account for the initial columns being kept
      for (HighsInt iCol = 0; iCol < delete_from_col; iCol++) {
        assert(new_index[iCol] >= 0);
        for (HighsInt iEl = save_start[iCol]; iEl < save_start[iCol + 1];
             iEl++) {
          HighsInt iRow = new_index[this->index_[iEl]];
          if (iRow < 0) continue;
          this->index_[new_num_entries] = iRow;
          this->value_[new_num_entries] = this->value_[iEl];
          if (this->value_[new_num_entries]) new_num_nz++;
          new_num_entries++;
        }
        new_dim++;
        this->start_[new_dim] = new_num_entries;
      }
      assert(new_dim == delete_from_col);
    }
    for (HighsInt iCol = keep_from_col; iCol <= keep_to_col; iCol++) {
      assert(new_index[iCol] >= 0);
      for (HighsInt iEl = save_start[iCol]; iEl < save_start[iCol + 1]; iEl++) {
        HighsInt iRow = new_index[this->index_[iEl]];
        if (iRow < 0) continue;
        this->index_[new_num_entries] = iRow;
        this->value_[new_num_entries] = this->value_[iEl];
        if (this->value_[new_num_entries]) new_num_nz++;
        new_num_entries++;
      }
      new_dim++;
      this->start_[new_dim] = new_num_entries;
    }
    if (keep_to_col >= this->dim_ - 1) break;
  }
  assert(new_dim == check_new_dim);
  this->dim_ = new_dim;
  if (!new_num_nz) {
    this->clear();
  } else {
    this->exactResize();
  }
}